

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_features.cpp
# Opt level: O0

void __thiscall Am_Feature_Vector_Data::Am_Feature_Vector_Data(Am_Feature_Vector_Data *this)

{
  Vector pdVar1;
  int local_20;
  int i;
  Am_Feature_Vector_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00410228;
  Am_Point_List::Am_Point_List(&this->points);
  pdVar1 = NewVector(0xb);
  this->y = pdVar1;
  this->npoints = 0;
  this->initial_cos = 0.0;
  this->initial_sin = 0.0;
  this->path_r = 0.0;
  this->path_th = 0.0;
  this->abs_th = 0.0;
  this->sharpness = 0.0;
  for (local_20 = 0; local_20 < 0xb; local_20 = local_20 + 1) {
    this->y[local_20] = 0.0;
  }
  this->calculated = false;
  return;
}

Assistant:

Am_Feature_Vector_Data::Am_Feature_Vector_Data()
{
  int i;

  y = NewVector(NFEATURES);

  npoints = 0;
  initial_sin = initial_cos = 0.0;
  path_r = 0;
  path_th = 0;
  abs_th = 0;
  sharpness = 0;
  for (i = 0; i < NFEATURES; i++)
    y[i] = 0.0;
  calculated = false;
}